

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRProgram.h
# Opt level: O3

IRBuiltinFunction * __thiscall
flow::IRProgram::getBuiltinFunction(IRProgram *this,NativeCallback *cb)

{
  vector<std::unique_ptr<flow::IRBuiltinFunction,_std::default_delete<flow::IRBuiltinFunction>_>,_std::allocator<std::unique_ptr<flow::IRBuiltinFunction,_std::default_delete<flow::IRBuiltinFunction>_>_>_>
  *this_00;
  bool bVar1;
  Signature *this_01;
  Signature *v;
  tuple<flow::IRBuiltinFunction_*,_std::default_delete<flow::IRBuiltinFunction>_> this_02;
  pointer puVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  __uniq_ptr_impl<flow::IRBuiltinFunction,_std::default_delete<flow::IRBuiltinFunction>_> local_40;
  IRProgram *local_38;
  
  this_00 = &this->builtinFunctions_;
  lVar5 = (long)(this->builtinFunctions_).
                super__Vector_base<std::unique_ptr<flow::IRBuiltinFunction,_std::default_delete<flow::IRBuiltinFunction>_>,_std::allocator<std::unique_ptr<flow::IRBuiltinFunction,_std::default_delete<flow::IRBuiltinFunction>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->builtinFunctions_).
                super__Vector_base<std::unique_ptr<flow::IRBuiltinFunction,_std::default_delete<flow::IRBuiltinFunction>_>,_std::allocator<std::unique_ptr<flow::IRBuiltinFunction,_std::default_delete<flow::IRBuiltinFunction>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_38 = this;
  if (lVar5 != 0) {
    lVar4 = 0;
    lVar3 = 0;
    do {
      this_01 = NativeCallback::signature
                          (*(NativeCallback **)
                            ((long)(this_00->
                                   super__Vector_base<std::unique_ptr<flow::IRBuiltinFunction,_std::default_delete<flow::IRBuiltinFunction>_>,_std::allocator<std::unique_ptr<flow::IRBuiltinFunction,_std::default_delete<flow::IRBuiltinFunction>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start[lVar3]._M_t.
                                   super___uniq_ptr_impl<flow::IRBuiltinFunction,_std::default_delete<flow::IRBuiltinFunction>_>
                            + 0x48));
      v = NativeCallback::signature(cb);
      bVar1 = Signature::operator==(this_01,v);
      if (bVar1) {
        puVar2 = (pointer)((long)(this_00->
                                 super__Vector_base<std::unique_ptr<flow::IRBuiltinFunction,_std::default_delete<flow::IRBuiltinFunction>_>,_std::allocator<std::unique_ptr<flow::IRBuiltinFunction,_std::default_delete<flow::IRBuiltinFunction>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start - lVar4);
        goto LAB_00116902;
      }
      lVar3 = lVar3 + 1;
      lVar4 = lVar4 + -8;
    } while (lVar5 >> 3 != lVar3);
  }
  this_02.
  super__Tuple_impl<0UL,_flow::IRBuiltinFunction_*,_std::default_delete<flow::IRBuiltinFunction>_>.
  super__Head_base<0UL,_flow::IRBuiltinFunction_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_flow::IRBuiltinFunction_*,_std::default_delete<flow::IRBuiltinFunction>_>)
       operator_new(0x50);
  IRBuiltinFunction::IRBuiltinFunction
            ((IRBuiltinFunction *)
             this_02.
             super__Tuple_impl<0UL,_flow::IRBuiltinFunction_*,_std::default_delete<flow::IRBuiltinFunction>_>
             .super__Head_base<0UL,_flow::IRBuiltinFunction_*,_false>._M_head_impl,cb);
  local_40._M_t.
  super__Tuple_impl<0UL,_flow::IRBuiltinFunction_*,_std::default_delete<flow::IRBuiltinFunction>_>.
  super__Head_base<0UL,_flow::IRBuiltinFunction_*,_false>._M_head_impl =
       (tuple<flow::IRBuiltinFunction_*,_std::default_delete<flow::IRBuiltinFunction>_>)
       (tuple<flow::IRBuiltinFunction_*,_std::default_delete<flow::IRBuiltinFunction>_>)
       this_02.
       super__Tuple_impl<0UL,_flow::IRBuiltinFunction_*,_std::default_delete<flow::IRBuiltinFunction>_>
       .super__Head_base<0UL,_flow::IRBuiltinFunction_*,_false>._M_head_impl;
  std::
  vector<std::unique_ptr<flow::IRBuiltinFunction,std::default_delete<flow::IRBuiltinFunction>>,std::allocator<std::unique_ptr<flow::IRBuiltinFunction,std::default_delete<flow::IRBuiltinFunction>>>>
  ::
  emplace_back<std::unique_ptr<flow::IRBuiltinFunction,std::default_delete<flow::IRBuiltinFunction>>>
            ((vector<std::unique_ptr<flow::IRBuiltinFunction,std::default_delete<flow::IRBuiltinFunction>>,std::allocator<std::unique_ptr<flow::IRBuiltinFunction,std::default_delete<flow::IRBuiltinFunction>>>>
              *)this_00,
             (unique_ptr<flow::IRBuiltinFunction,_std::default_delete<flow::IRBuiltinFunction>_> *)
             &local_40);
  if ((_Tuple_impl<0UL,_flow::IRBuiltinFunction_*,_std::default_delete<flow::IRBuiltinFunction>_>)
      local_40._M_t.
      super__Tuple_impl<0UL,_flow::IRBuiltinFunction_*,_std::default_delete<flow::IRBuiltinFunction>_>
      .super__Head_base<0UL,_flow::IRBuiltinFunction_*,_false>._M_head_impl !=
      (IRBuiltinFunction *)0x0) {
    (**(code **)(*(long *)local_40._M_t.
                          super__Tuple_impl<0UL,_flow::IRBuiltinFunction_*,_std::default_delete<flow::IRBuiltinFunction>_>
                          .super__Head_base<0UL,_flow::IRBuiltinFunction_*,_false>._M_head_impl + 8)
    )();
  }
  puVar2 = (local_38->builtinFunctions_).
           super__Vector_base<std::unique_ptr<flow::IRBuiltinFunction,_std::default_delete<flow::IRBuiltinFunction>_>,_std::allocator<std::unique_ptr<flow::IRBuiltinFunction,_std::default_delete<flow::IRBuiltinFunction>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + -1;
LAB_00116902:
  return (puVar2->_M_t).
         super___uniq_ptr_impl<flow::IRBuiltinFunction,_std::default_delete<flow::IRBuiltinFunction>_>
         ._M_t.
         super__Tuple_impl<0UL,_flow::IRBuiltinFunction_*,_std::default_delete<flow::IRBuiltinFunction>_>
         .super__Head_base<0UL,_flow::IRBuiltinFunction_*,_false>._M_head_impl;
}

Assistant:

IRBuiltinFunction* getBuiltinFunction(const NativeCallback& cb) {
    for (size_t i = 0, e = builtinFunctions_.size(); i != e; ++i)
      if (builtinFunctions_[i]->signature() == cb.signature())
        return builtinFunctions_[i].get();

    builtinFunctions_.emplace_back(std::make_unique<IRBuiltinFunction>(cb));
    return builtinFunctions_.back().get();
  }